

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackTexture.cpp
# Opt level: O0

Texture __thiscall
Rml::CallbackTextureSource::GetTexture(CallbackTextureSource *this,RenderManager *render_manager)

{
  CallbackTexture *callback;
  bool bVar1;
  Texture TVar2;
  function<bool_(const_Rml::CallbackTextureInterface_&)> local_68;
  undefined1 local_48 [32];
  CallbackTexture *texture;
  RenderManager *render_manager_local;
  CallbackTextureSource *this_local;
  
  local_48._16_8_ = render_manager;
  texture = (CallbackTexture *)render_manager;
  render_manager_local = (RenderManager *)this;
  local_48._24_8_ =
       itlib::
       flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
       ::operator[]<Rml::RenderManager*>
                 ((flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
                   *)&this->textures,(RenderManager **)(local_48 + 0x10));
  bVar1 = UniqueRenderResource::operator_cast_to_bool((UniqueRenderResource *)local_48._24_8_);
  callback = texture;
  if (!bVar1) {
    ::std::function<bool_(const_Rml::CallbackTextureInterface_&)>::function
              (&local_68,&this->callback);
    RenderManager::MakeCallbackTexture
              ((RenderManager *)local_48,(CallbackTextureFunction *)callback);
    CallbackTexture::operator=((CallbackTexture *)local_48._24_8_,(CallbackTexture *)local_48);
    CallbackTexture::~CallbackTexture((CallbackTexture *)local_48);
    ::std::function<bool_(const_Rml::CallbackTextureInterface_&)>::~function(&local_68);
  }
  TVar2 = CallbackTexture::operator_cast_to_Texture((CallbackTexture *)local_48._24_8_);
  return TVar2;
}

Assistant:

Texture CallbackTextureSource::GetTexture(RenderManager& render_manager) const
{
	CallbackTexture& texture = textures[&render_manager];
	if (!texture)
		texture = render_manager.MakeCallbackTexture(callback);
	return Texture(texture);
}